

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RandomGen.cpp
# Opt level: O1

void __thiscall RandomGen::SetSeed(RandomGen *this,uint64_t s)

{
  ulong uVar1;
  runtime_error *this_00;
  ulong uVar2;
  ulong uVar3;
  
  if (this->rng_locked != true) {
    uVar2 = (s + 0x9e3779b97f4a7c15 >> 0x1e ^ s + 0x9e3779b97f4a7c15) * -0x40a7b892e31b1a47;
    uVar3 = (uVar2 >> 0x1b ^ uVar2) * -0x6b2fb644ecceee15;
    uVar3 = uVar3 >> 0x1f ^ uVar3;
    uVar2 = (uVar3 + 0x9e3779b97f4a7c15 >> 0x1e ^ uVar3 + 0x9e3779b97f4a7c15) * -0x40a7b892e31b1a47;
    uVar1 = (uVar2 >> 0x1b ^ uVar2) * -0x6b2fb644ecceee15;
    uVar1 = uVar1 >> 0x1f ^ uVar1;
    uVar2 = 1;
    if (uVar1 != 0 || uVar3 != 0) {
      uVar2 = uVar1;
    }
    (this->rng).super_xoroshiro<unsigned_long,_unsigned_long,_24U,_16U,_37U>.s0_ = uVar3;
    (this->rng).super_xoroshiro<unsigned_long,_unsigned_long,_24U,_16U,_37U>.s1_ = uVar2;
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"You can not change the seed because it is locked.");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void RandomGen::SetSeed(uint64_t s) {
  if (rng_locked) {
    throw std::runtime_error("You can not change the seed because it is locked.");
  }
  uint64_t s1 = splitmix64(s);
  rng = xoroshiro128plus64(s1, splitmix64(s1));
}